

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputedValues.h
# Opt level: O2

void __thiscall Rml::Style::ComputedValues::ComputedValues(ComputedValues *this,Element *element)

{
  this->element = element;
  *(ulong *)&this->common = *(ulong *)&this->common & 0xfffff80000800000 | 0x15200002;
  (this->common).width_value = 0.0;
  (this->common).height_value = 0.0;
  (this->common).margin_top_value = 0.0;
  (this->common).margin_right_value = 0.0;
  (this->common).margin_bottom_value = 0.0;
  (this->common).margin_left_value = 0.0;
  (this->common).padding_top_value = 0.0;
  (this->common).padding_right_value = 0.0;
  (this->common).border_bottom_width = 0;
  (this->common).border_left_width = 0;
  (this->common).padding_bottom_value = 0.0;
  (this->common).padding_left_value = 0.0;
  (this->common).top_value = 0.0;
  (this->common).right_value = 0.0;
  (this->common).bottom_value = 0.0;
  (this->common).left_value = 0.0;
  (this->common).z_index_value = 0.0;
  (this->common).border_top_width = 0;
  (this->common).border_right_width = 0;
  (this->common).border_top_color.red = 0xff;
  (this->common).border_top_color.green = 0xff;
  (this->common).border_top_color.blue = 0xff;
  (this->common).border_top_color.alpha = 0xff;
  (this->common).border_right_color.red = 0xff;
  (this->common).border_right_color.green = 0xff;
  (this->common).border_right_color.blue = 0xff;
  (this->common).border_right_color.alpha = 0xff;
  (this->common).border_bottom_color.red = 0xff;
  (this->common).border_bottom_color.green = 0xff;
  (this->common).border_bottom_color.blue = 0xff;
  (this->common).border_bottom_color.alpha = 0xff;
  (this->common).border_left_color.red = 0xff;
  (this->common).border_left_color.green = 0xff;
  (this->common).border_left_color.blue = 0xff;
  (this->common).border_left_color.alpha = 0xff;
  (this->common).background_color.red = '\0';
  (this->common).background_color.green = '\0';
  (this->common).background_color.blue = '\0';
  (this->common).background_color.alpha = '\0';
  InheritedValues::InheritedValues(&this->inherited);
  RareValues::RareValues(&this->rare);
  return;
}

Assistant:

explicit ComputedValues(Element* element) : element(element) {}